

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

bool __thiscall DPlayerMenu::Responder(DPlayerMenu *this,event_t *ev)

{
  bool bVar1;
  FListMenuItem *pFVar2;
  FName local_c;
  
  if (((ev->type == '\x04') && (ev->subtype == '\x04')) && (ev->data1 == 0x20)) {
    this->mRotation = 8 - this->mRotation;
    local_c.Index = 0x1ee;
    pFVar2 = DListMenu::GetItem(&this->super_DListMenu,&local_c);
    if (pFVar2 != (FListMenuItem *)0x0) {
      (*pFVar2->_vptr_FListMenuItem[10])(pFVar2,0x10001,(ulong)(uint)this->mRotation);
    }
    return true;
  }
  bVar1 = DListMenu::Responder(&this->super_DListMenu,ev);
  return bVar1;
}

Assistant:

bool DPlayerMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_Char && ev->data1 == ' ')
	{
		// turn the player sprite around
		mRotation = 8 - mRotation;
		FListMenuItem *li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_ROTATION, mRotation);
		}
		return true;
	}
	return Super::Responder(ev);
}